

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O3

size_t convert<int>(char *buf,int value)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  int i;
  char *p;
  char *pcVar6;
  bool bVar7;
  
  pcVar3 = buf;
  iVar2 = value;
  do {
    pcVar4 = pcVar3;
    *pcVar4 = zero[iVar2 % 10];
    pcVar3 = pcVar4 + 1;
    uVar5 = iVar2 + 9;
    iVar2 = iVar2 / 10;
  } while (0x12 < uVar5);
  if (value < 0) {
    *pcVar3 = '-';
    pcVar3 = pcVar4 + 2;
  }
  *pcVar3 = '\0';
  pcVar4 = pcVar3 + -1;
  if (buf < pcVar4 && (long)pcVar3 - (long)buf != 0) {
    pcVar6 = buf + 1;
    do {
      cVar1 = pcVar6[-1];
      pcVar6[-1] = *pcVar4;
      *pcVar4 = cVar1;
      pcVar4 = pcVar4 + -1;
      bVar7 = pcVar6 < pcVar4;
      pcVar6 = pcVar6 + 1;
    } while (bVar7);
  }
  return (long)pcVar3 - (long)buf;
}

Assistant:

size_t convert(char buf[], T value){
    T i = value;
    char* p=buf;

    do{
        int lsd=static_cast<int>(i%10);
        i /=10;
        *p++ = zero[lsd];
    }while(i!=0);

    if(value<0){
        *p++ = '-';
    }
    *p = '\0';
    std::reverse(buf, p);

    return p-buf;
}